

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void update_new_objs_from_pos
               (Am_Value *objs_value,int left,int top,Am_Value *new_data_value,bool growing,
               Am_Object *command_obj)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Inter_Location local_c8;
  Am_Inter_Location loc;
  Am_Value_List local_b0;
  Am_Object local_a0;
  Am_Object owner;
  int max_bottom;
  int max_right;
  int min_top;
  int min_left;
  Am_Value_List new_data_value_list;
  Am_Value_List objs_list;
  Am_Object obj;
  Am_Value local_50;
  Am_Value local_40;
  Am_Object *local_30;
  Am_Object *command_obj_local;
  Am_Value *pAStack_20;
  bool growing_local;
  Am_Value *new_data_value_local;
  int top_local;
  int left_local;
  Am_Value *objs_value_local;
  
  local_30 = command_obj;
  command_obj_local._7_1_ = growing;
  pAStack_20 = new_data_value;
  new_data_value_local._0_4_ = top;
  new_data_value_local._4_4_ = left;
  _top_local = objs_value;
  if (growing) {
    Am_Value::Am_Value(&local_40,objs_value);
    Am_Value::Am_Value(&local_50,pAStack_20);
    update_objs_from_value(&local_40,&local_50,(bool)(command_obj_local._7_1_ & 1),local_30);
    Am_Value::~Am_Value(&local_50);
    Am_Value::~Am_Value(&local_40);
  }
  else {
    Am_Object::Am_Object((Am_Object *)&objs_list.item);
    bVar1 = Am_Value_List::Test(objs_value);
    if (bVar1) {
      Am_Value_List::Am_Value_List((Am_Value_List *)&new_data_value_list.item);
      Am_Value_List::Am_Value_List((Am_Value_List *)&min_top);
      Am_Value_List::operator=((Am_Value_List *)&new_data_value_list.item,objs_value);
      Am_Object::Am_Object(&local_a0);
      Am_Value_List::Am_Value_List(&local_b0,(Am_Value_List *)&new_data_value_list.item);
      calculate_group_size
                (&local_b0,&max_right,&max_bottom,(int *)((long)&owner.data + 4),(int *)&owner,
                 &local_a0);
      Am_Value_List::~Am_Value_List(&local_b0);
      Am_Value_List::Am_Value_List((Am_Value_List *)&loc,(Am_Value_List *)&new_data_value_list.item)
      ;
      adjust_all_objects_position_for_undo
                ((Am_Value_List *)&loc,new_data_value_local._4_4_ - max_right,
                 (int)new_data_value_local - max_bottom,(Am_Value_List *)&min_top);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&loc);
      pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&min_top);
      Am_Value::operator=(pAStack_20,pAVar2);
      Am_Object::Set(local_30,100,max_right,0);
      Am_Object::Set(local_30,0x65,max_bottom,0);
      Am_Object::~Am_Object(&local_a0);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&min_top);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&new_data_value_list.item);
    }
    else if (objs_value->type == 0xa001) {
      Am_Object::operator=((Am_Object *)&objs_list.item,objs_value);
      Am_Object::Set((Am_Object *)&objs_list.item,100,new_data_value_local._4_4_,0);
      Am_Object::Set((Am_Object *)&objs_list.item,0x65,(int)new_data_value_local,0);
      Am_Object::Set(local_30,100,new_data_value_local._4_4_,0);
      Am_Object::Set(local_30,0x65,(int)new_data_value_local,0);
      Am_Inter_Location::Am_Inter_Location(&local_c8,(Am_Object *)&objs_list.item);
      Am_Inter_Location::Set_Growing(&local_c8,false,true);
      pAVar2 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&local_c8);
      Am_Value::operator=(pAStack_20,pAVar2);
      Am_Inter_Location::~Am_Inter_Location(&local_c8);
    }
    Am_Object::~Am_Object((Am_Object *)&objs_list.item);
  }
  return;
}

Assistant:

void
update_new_objs_from_pos(Am_Value objs_value, int left, int top,
                         Am_Value &new_data_value, bool growing,
                         Am_Object &command_obj)
{
  if (growing) // then must be a single object, so new_data_value will be OK
    update_objs_from_value(objs_value, new_data_value, growing, command_obj);
  else {
    Am_Object obj;
    if (Am_Value_List::Test(objs_value)) {
      Am_Value_List objs_list, new_data_value_list;
      objs_list = objs_value;
      // calculate group offset and move
      int min_left, min_top, max_right, max_bottom;
      Am_Object owner;
      calculate_group_size(objs_list, min_left, min_top, max_right, max_bottom,
                           owner);
      adjust_all_objects_position_for_undo(objs_list, left - min_left,
                                           top - min_top, new_data_value_list);
      new_data_value = new_data_value_list;
      command_obj.Set(Am_LEFT, min_left);
      command_obj.Set(Am_TOP, min_top);
    } else if (objs_value.type == Am_OBJECT) {
      obj = objs_value;
      obj.Set(Am_LEFT, left); // , Am_NO_ANIMATION
      obj.Set(Am_TOP, top);   // , Am_NO_ANIMATION
      command_obj.Set(Am_LEFT, left);
      command_obj.Set(Am_TOP, top);
      Am_Inter_Location loc(obj);
      loc.Set_Growing(false);
      new_data_value = loc;
    }
  }
}